

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatawidgetmapper.cpp
# Opt level: O1

void QDataWidgetMapper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  SubmitPolicy SVar1;
  QDataWidgetMapperPrivate *this;
  pointer pWVar2;
  int *piVar3;
  SubmitPolicy *pSVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  undefined4 uVar8;
  WidgetMapper *e;
  pointer m;
  long in_FS_OFFSET;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_4c = *_a[1];
    puStack_40 = &local_4c;
    local_48 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_48);
    break;
  case 1:
    this = *(QDataWidgetMapperPrivate **)(_o + 8);
    pWVar2 = (this->widgetMap).
             super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (m = (this->widgetMap).
             super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
             ._M_impl.super__Vector_impl_data._M_start; m != pWVar2; m = m + 1) {
      QDataWidgetMapperPrivate::populate(this,m);
    }
    break;
  case 2:
    bVar5 = submit((QDataWidgetMapper *)_o);
    if (*_a != (void *)0x0) {
      *(bool *)*_a = bVar5;
    }
    break;
  case 3:
    lVar7 = *(long *)_o;
    uVar8 = 0;
    goto LAB_00572636;
  case 4:
    toLast((QDataWidgetMapper *)_o);
    break;
  case 5:
    toNext((QDataWidgetMapper *)_o);
    break;
  case 6:
    toPrevious((QDataWidgetMapper *)_o);
    break;
  case 7:
    uVar8 = *_a[1];
    lVar7 = *(long *)_o;
LAB_00572636:
    (**(code **)(lVar7 + 0x60))(_o,uVar8);
    break;
  case 8:
    setCurrentModelIndex((QDataWidgetMapper *)_o,(QModelIndex *)_a[1]);
  }
  if (_c == ReadProperty) {
switchD_0057259a_caseD_1:
    piVar3 = (int *)*_a;
    if (_id == 2) {
      iVar6 = *(int *)(*(long *)(_o + 8) + 0x8c);
LAB_0057270c:
      *piVar3 = iVar6;
    }
    else {
      if (_id == 1) {
        iVar6 = *(int *)(*(long *)(_o + 8) + 0x88);
        goto LAB_0057270c;
      }
      if (_id == 0) {
        iVar6 = currentIndex((QDataWidgetMapper *)_o);
        goto LAB_0057270c;
      }
    }
    if (_c != WriteProperty) goto switchD_0057259a_caseD_3;
  }
  else if (_c != WriteProperty) {
    if (_c != IndexOfMethod) goto switchD_0057259a_caseD_3;
    if ((*_a[1] == currentIndexChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_0057259a_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_0057259a_caseD_3;
      goto switchD_0057259a_caseD_1;
    }
  }
  pSVar4 = (SubmitPolicy *)*_a;
  if (_id == 2) {
    setSubmitPolicy((QDataWidgetMapper *)_o,*pSVar4);
  }
  else if (_id == 1) {
    SVar1 = *pSVar4;
    lVar7 = *(long *)(_o + 8);
    if (*(SubmitPolicy *)(lVar7 + 0x88) != SVar1) {
      clearMapping((QDataWidgetMapper *)_o);
      *(SubmitPolicy *)(lVar7 + 0x88) = SVar1;
    }
  }
  else if (_id == 0) {
    (**(code **)(*(long *)_o + 0x60))(_o,*pSVar4);
  }
switchD_0057259a_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDataWidgetMapper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->revert(); break;
        case 2: { bool _r = _t->submit();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 3: _t->toFirst(); break;
        case 4: _t->toLast(); break;
        case 5: _t->toNext(); break;
        case 6: _t->toPrevious(); break;
        case 7: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->setCurrentModelIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDataWidgetMapper::*)(int )>(_a, &QDataWidgetMapper::currentIndexChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 2: *reinterpret_cast<SubmitPolicy*>(_v) = _t->submitPolicy(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 2: _t->setSubmitPolicy(*reinterpret_cast<SubmitPolicy*>(_v)); break;
        default: break;
        }
    }
}